

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
Singleton<Catch::(anonymous_namespace)::RegistryHub,Catch::IRegistryHub,Catch::IMutableRegistryHub>
::~Singleton(Singleton<Catch::(anonymous_namespace)::RegistryHub,Catch::IRegistryHub,Catch::IMutableRegistryHub>
             *this)

{
  *(undefined ***)(this + -0x148) = &PTR__RegistryHub_001a3f38;
  *(undefined ***)(this + -0x140) = &PTR__RegistryHub_001a3fb8;
  *(undefined ***)(this + -0x138) = &PTR__RegistryHub_001a4010;
  *(undefined ***)(this + -0x20) = &PTR__EnumValuesRegistry_001a2b20;
  clara::std::
  vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
  ::~vector((vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
             *)(this + -0x18));
  clara::std::
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  ::~vector((vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             *)(this + -0x38));
  *(undefined ***)(this + -0x70) = &PTR__TagAliasRegistry_001a2198;
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
               *)(this + -0x68));
  *(undefined ***)(this + -0x90) = &PTR__ExceptionTranslatorRegistry_001a1b60;
  clara::std::
  vector<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>,_std::allocator<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>_>_>
  ::~vector((vector<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>,_std::allocator<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>_>_>
             *)(this + -0x88));
  *(undefined ***)(this + -0xe0) = &PTR__ReporterRegistry_001a1f38;
  clara::std::
  vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
  ::~vector((vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
             *)(this + -0xa8));
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
               *)(this + -0xd8));
  TestRegistry::~TestRegistry((TestRegistry *)(this + -0x130));
  return;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }